

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.hpp
# Opt level: O0

bool helics::fileops::callIfMember
               (value *element,string *key,
               function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
               *call)

{
  Time __args_1;
  basic_value<toml::type_config> *in_RDX;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
  *in_RSI;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> val;
  value uval;
  basic_value<toml::type_config> *in_stack_fffffffffffffe10;
  basic_value<toml::type_config> *opt;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  basic_value<toml::type_config> *in_stack_fffffffffffffe38;
  basic_value<toml::type_config> *in_stack_fffffffffffffe40;
  basic_value<toml::type_config> local_e8;
  basic_value<toml::type_config> *local_20;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
  *local_18;
  bool local_1;
  
  opt = &local_e8;
  local_20 = in_RDX;
  local_18 = in_RSI;
  toml::basic_value<toml::type_config>::basic_value(in_stack_fffffffffffffe10);
  toml::find_or<toml::type_config,std::__cxx11::string>
            (in_stack_fffffffffffffe38,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),opt);
  toml::basic_value<toml::type_config>::basic_value
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  local_1 = toml::basic_value<toml::type_config>::is_empty
                      ((basic_value<toml::type_config> *)0x420f84);
  if (!local_1) {
    __args_1 = loadTomlTime((value *)val.region_.first_,val.region_.length_._4_4_);
    CLI::std::
    function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_TimeRepresentation<count_time<9,_long>_>)>
    ::operator()(local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_20,
                 (TimeRepresentation<count_time<9,_long>_>)__args_1.internalTimeCode);
    in_stack_fffffffffffffe10 = local_20;
  }
  local_1 = !local_1;
  toml::basic_value<toml::type_config>::~basic_value(in_stack_fffffffffffffe10);
  toml::basic_value<toml::type_config>::~basic_value(in_stack_fffffffffffffe10);
  return (bool)(local_1 & 1);
}

Assistant:

inline bool callIfMember(const toml::value& element,
                         const std::string& key,
                         const std::function<void(const std::string&, helics::Time)>& call)
{
    toml::value uval;
    auto val = toml::find_or(element, key, uval);

    if (!val.is_empty()) {
        call(key, loadTomlTime(val));
        return true;
    }
    return false;
}